

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O0

void __thiscall Fl_Widget::copy_tooltip(Fl_Widget *this,char *text)

{
  uint uVar1;
  char *pcVar2;
  char *text_local;
  Fl_Widget *this_local;
  
  Fl_Tooltip::set_enter_exit_once_();
  uVar1 = flags(this);
  if ((uVar1 & 0x20000) != 0) {
    free(this->tooltip_);
  }
  if (text == (char *)0x0) {
    clear_flag(this,0x20000);
    this->tooltip_ = (char *)0x0;
  }
  else {
    set_flag(this,0x20000);
    pcVar2 = strdup(text);
    this->tooltip_ = pcVar2;
  }
  return;
}

Assistant:

void Fl_Widget::copy_tooltip(const char *text) {
  Fl_Tooltip::set_enter_exit_once_();
  if (flags() & COPIED_TOOLTIP) free((void *)(tooltip_));
  if (text) {
    set_flag(COPIED_TOOLTIP);
    tooltip_ = strdup(text);
  } else {
    clear_flag(COPIED_TOOLTIP);
    tooltip_ = (char *)0;
  }
}